

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void DecodeAndPrepareData(SstStream Stream,int Writer)

{
  int iVar1;
  undefined8 uVar2;
  size_t __size;
  char *pcVar3;
  SstStream Stream_00;
  FFSVarRec_conflict pFVar4;
  uint in_ESI;
  long in_RDI;
  FFSVarRec_conflict VarRec;
  char *ArrayName;
  ArrayRec *data_base;
  int i;
  FFSBuffer decode_buf;
  size_t DecodedLength;
  size_t DataSize;
  FMStructDescList List;
  FMFormat Format;
  FMContext FMC;
  int DumpData;
  void *BaseData;
  FMStructDescList FormatList;
  FMFieldList FieldList;
  FFSTypeHandle FFSformat;
  FFSReaderPerWriterRec *WriterInfo;
  FFSReaderMarshalBase *Info;
  int local_7c;
  void *local_40;
  long local_38;
  long local_30;
  undefined8 local_28;
  long local_20;
  long local_18;
  uint local_c;
  long local_8;
  
  local_18 = *(long *)(in_RDI + 0x300);
  local_20 = *(long *)(local_18 + 0x40) + (long)(int)in_ESI * 0x18;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_28 = FFSTypeHandle_from_encode
                       (*(undefined8 *)(in_RDI + 0x2c8),*(undefined8 *)(local_20 + 8));
  iVar1 = FFShas_conversion(local_28);
  if (iVar1 == 0) {
    uVar2 = FMContext_from_FFS(*(undefined8 *)(local_8 + 0x2c8));
    uVar2 = FMformat_from_ID(uVar2,*(undefined8 *)(local_20 + 8));
    uVar2 = format_list_of_FMFormat(uVar2);
    uVar2 = FMcopy_struct_list(uVar2);
    FMlocalize_structs(uVar2);
    establish_conversion(*(undefined8 *)(local_8 + 0x2c8),local_28,uVar2);
    FMfree_struct_list(uVar2);
  }
  iVar1 = FFSdecode_in_place_possible(local_28);
  if (iVar1 == 0) {
    __size = FFS_est_decode_length
                       (*(undefined8 *)(local_8 + 0x2c8),*(undefined8 *)(local_20 + 8),
                        *(undefined8 *)
                         (*(long *)(*(long *)(local_18 + 0x20) + (long)(int)local_c * 8) + 0x10));
    local_40 = malloc(__size);
    uVar2 = create_fixed_FFSBuffer(local_40,__size);
    FFSdecode_to_buffer(*(undefined8 *)(local_8 + 0x2c8),*(undefined8 *)(local_20 + 8),uVar2);
  }
  else {
    FFSdecode_in_place(*(undefined8 *)(local_8 + 0x2c8),*(undefined8 *)(local_20 + 8),&local_40);
  }
  pcVar3 = getenv("SstDumpData");
  if (pcVar3 != (char *)0x0) {
    printf("\nOn Rank %d, IncomingDatablock from writer %d is %p :\n",
           (ulong)*(uint *)(local_8 + 0xa8),(ulong)local_c,local_40);
    uVar2 = FMFormat_of_original(local_28);
    FMdump_data(uVar2,local_40,0xfa000);
  }
  *(void **)(*(long *)(local_18 + 0x30) + (long)(int)local_c * 8) = local_40;
  uVar2 = FMFormat_of_original(local_28);
  local_38 = format_list_of_FMFormat(uVar2);
  local_30 = *(long *)(local_38 + 8);
  *(long *)(*(long *)(local_18 + 0x38) + (long)(int)local_c * 8) = local_30;
  local_7c = 0;
  while (*(long *)(local_30 + (long)local_7c * 0x18) != 0) {
    Stream_00 = (SstStream)
                ((long)local_40 + (long)*(int *)(local_30 + (long)local_7c * 0x18 + 0x14));
    pFVar4 = LookupVarByName(Stream_00,
                             (char *)(*(long *)(local_30 + (long)(local_7c + 1) * 0x18) + 4));
    if (pFVar4 != (FFSVarRec_conflict)0x0) {
      pFVar4->PerWriterIncomingData[(int)local_c] = Stream_00->mpiComm;
      pFVar4->PerWriterIncomingSize[(int)local_c] = (size_t)Stream_00->CPInfo;
    }
    local_7c = local_7c + 2;
  }
  return;
}

Assistant:

static void DecodeAndPrepareData(SstStream Stream, int Writer)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    FFSReaderPerWriterRec *WriterInfo = &Info->WriterInfo[Writer];
    FFSTypeHandle FFSformat;
    FMFieldList FieldList;
    FMStructDescList FormatList;
    void *BaseData;
    int DumpData = -1;

    FFSformat = FFSTypeHandle_from_encode(Stream->ReaderFFSContext, WriterInfo->RawBuffer);

    if (!FFShas_conversion(FFSformat))
    {
        FMContext FMC = FMContext_from_FFS(Stream->ReaderFFSContext);
        FMFormat Format = FMformat_from_ID(FMC, WriterInfo->RawBuffer);
        FMStructDescList List = FMcopy_struct_list(format_list_of_FMFormat(Format));
        FMlocalize_structs(List);
        establish_conversion(Stream->ReaderFFSContext, FFSformat, List);
        FMfree_struct_list(List);
    }
    if (FFSdecode_in_place_possible(FFSformat))
    {
        FFSdecode_in_place(Stream->ReaderFFSContext, WriterInfo->RawBuffer, &BaseData);
    }
    else
    {
        size_t DataSize =
            ((struct FFSMetadataInfoStruct *)Info->MetadataBaseAddrs[Writer])->DataBlockSize;
        size_t DecodedLength =
            FFS_est_decode_length(Stream->ReaderFFSContext, WriterInfo->RawBuffer, DataSize);
        BaseData = malloc(DecodedLength);
        FFSBuffer decode_buf = create_fixed_FFSBuffer(BaseData, DecodedLength);
        FFSdecode_to_buffer(Stream->ReaderFFSContext, WriterInfo->RawBuffer, decode_buf);
    }
    if (DumpData == -1)
    {
        DumpData = (getenv("SstDumpData") != NULL);
    }
    if (DumpData)
    {
        printf("\nOn Rank %d, IncomingDatablock from writer %d is %p :\n", Stream->Rank, Writer,
               BaseData);
        FMdump_data(FMFormat_of_original(FFSformat), BaseData, 1024000);
    }
    Info->DataBaseAddrs[Writer] = BaseData;
    FormatList = format_list_of_FMFormat(FMFormat_of_original(FFSformat));
    FieldList = FormatList[0].field_list;
    Info->DataFieldLists[Writer] = FieldList;

    int i = 0;
    while (FieldList[i].field_name)
    {
        ArrayRec *data_base = (ArrayRec *)((char *)BaseData + FieldList[i].field_offset);
        const char *ArrayName = FieldList[i + 1].field_name + 4;
        FFSVarRec VarRec = LookupVarByName(Stream, ArrayName);
        if (VarRec)
        {
            VarRec->PerWriterIncomingData[Writer] = data_base->Array;
            VarRec->PerWriterIncomingSize[Writer] = data_base->ElemCount;
        }
        i += 2;
    }
}